

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_wide(MovDemuxer *this,MOVAtom atom)

{
  uint uVar1;
  uint64_t local_28 [2];
  
  if (7 < atom.size) {
    uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    if (uVar1 == 0) {
      uVar1 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
      local_28[0] = atom.size - 8;
      if (uVar1 == 0x7461646d) {
        if (local_28[0] == 0) {
          return 0;
        }
        if (this->m_mdat_pos == 0) {
          this->m_mdat_pos = (this->super_IOContextDemuxer).m_processedBytes;
          this->m_mdat_size = local_28[0];
        }
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        emplace_back<long&,long&>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                   &this->m_mdat_data,&(this->super_IOContextDemuxer).m_processedBytes,
                   (long *)local_28);
        return 0;
      }
    }
    else {
      local_28[0] = atom.size - 4;
    }
    IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,local_28[0]);
  }
  return 0;
}

Assistant:

int MovDemuxer::mov_read_wide(MOVAtom atom)
{
    if (atom.size < 8)
        return 0;  // continue
    if (get_be32() != 0)
    {  // 0 sized mdat atom... use the 'wide' atom size
        skip_bytes(atom.size - 4);
        return 0;
    }
    atom.type = get_le32();
    atom.offset += 8;
    atom.size -= 8;
    if (atom.type != MKTAG('m', 'd', 'a', 't'))
    {
        skip_bytes(atom.size);
        return 0;
    }
    const int err = mov_read_mdat(atom);
    return err;
}